

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O2

result_type __thiscall iutest::detail::iuRandom::genrand(iuRandom *this,uint max)

{
  result_type rVar1;
  uniform_int_distribution<unsigned_int> d;
  param_type local_8;
  
  local_8 = (param_type)((ulong)(max - 1) << 0x20);
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    ((uniform_int_distribution<unsigned_int> *)&local_8,&this->m_engine);
  return rVar1;
}

Assistant:

result_type genrand(unsigned int max)
    {
#if IUTEST_HAS_CXX_HDR_RANDOM
        ::std::uniform_int_distribution<unsigned int> d(0, max-1);
        return d(m_engine);
#else
        return genrand()%max;
#endif
    }